

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O3

void MOJOSHADER_glProgramReady(void)

{
  size_t sVar1;
  uint32 uVar2;
  MOJOSHADER_shaderType MVar3;
  MOJOSHADER_uniformType MVar4;
  int iVar5;
  MOJOSHADER_glProgram *pMVar6;
  MOJOSHADER_uniform *pMVar7;
  MOJOSHADER_parseData *pMVar8;
  MOJOSHADER_sampler *pMVar9;
  undefined8 uVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  GLfloat *pGVar14;
  uint uVar15;
  ulong uVar16;
  GLint *pGVar17;
  GLint *__s1;
  GLfloat *pGVar18;
  MOJOSHADER_glContext *pMVar19;
  long lVar20;
  ulong uVar21;
  MOJOSHADER_shaderType MVar22;
  uint uVar23;
  GLint *local_48;
  uint8 *local_40;
  
  pMVar6 = ctx->bound_program;
  if (pMVar6 != (MOJOSHADER_glProgram *)0x0) {
    update_enabled_arrays();
    pMVar19 = ctx;
    if (pMVar6->uses_pointsize != ctx->pointsize_enabled) {
      (**(code **)(ctx->profile + (ulong)(pMVar6->uses_pointsize == 0) * 8 + 0x78))(0x8642);
      pMVar19 = ctx;
      ctx->pointsize_enabled = pMVar6->uses_pointsize;
    }
    uVar2 = pMVar6->uniform_count;
    if (uVar2 == 0) {
      if (pMVar6->texbem_count == 0) {
        return;
      }
      if (pMVar6->generation == pMVar19->generation) {
        return;
      }
      bVar11 = true;
    }
    else {
      if (pMVar6->generation == pMVar19->generation) {
        return;
      }
      pGVar17 = pMVar6->vs_uniforms_bool;
      pGVar18 = pMVar6->vs_uniforms_float4;
      __s1 = pMVar6->vs_uniforms_int4;
      local_40 = pMVar19->vs_reg_file_b;
      local_48 = pMVar19->vs_reg_file_i;
      pGVar14 = pMVar19->vs_reg_file_f;
      bVar11 = false;
      MVar22 = MOJOSHADER_TYPE_VERTEX;
      uVar16 = 0;
      do {
        pMVar7 = pMVar6->uniforms[uVar16].uniform;
        iVar12 = pMVar7->array_count + (uint)(pMVar7->array_count == 0);
        if (pMVar7->constant != 0) {
          __assert_fail("!u->constant",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                        ,0x983,"void MOJOSHADER_glProgramReady(void)");
        }
        MVar3 = pMVar6->uniforms[uVar16].shader_type;
        MVar4 = pMVar7->type;
        iVar5 = pMVar7->index;
        if (MVar22 != MVar3) {
          if (MVar3 != MOJOSHADER_TYPE_PIXEL) {
            __assert_fail("0 && \"Unexpected shader type\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                          ,0x997,"void MOJOSHADER_glProgramReady(void)");
          }
          if (MVar22 != MOJOSHADER_TYPE_VERTEX) {
            __assert_fail("shader_type == MOJOSHADER_TYPE_VERTEX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                          ,0x98c,"void MOJOSHADER_glProgramReady(void)");
          }
          pGVar14 = ctx->ps_reg_file_f;
          local_48 = ctx->ps_reg_file_i;
          local_40 = ctx->ps_reg_file_b;
          pGVar18 = pMVar6->ps_uniforms_float4;
          __s1 = pMVar6->ps_uniforms_int4;
          pGVar17 = pMVar6->ps_uniforms_bool;
          MVar22 = MOJOSHADER_TYPE_PIXEL;
        }
        if (MVar4 == MOJOSHADER_UNIFORM_BOOL) {
          lVar20 = 0;
          do {
            if (pGVar17[lVar20] != (uint)local_40[lVar20 + iVar5]) {
              pGVar17[lVar20] = (uint)local_40[lVar20 + iVar5];
              bVar11 = true;
            }
            lVar20 = lVar20 + 1;
          } while (iVar12 != lVar20);
          pGVar17 = pGVar17 + iVar12;
        }
        else if (MVar4 == MOJOSHADER_UNIFORM_INT) {
          sVar1 = (long)(iVar12 * 4) * 4;
          iVar13 = bcmp(__s1,local_48 + (iVar5 << 2),sVar1);
          if (iVar13 != 0) {
            memcpy(__s1,local_48 + (iVar5 << 2),sVar1);
            bVar11 = true;
          }
          __s1 = __s1 + iVar12 * 4;
        }
        else if (MVar4 == MOJOSHADER_UNIFORM_FLOAT) {
          sVar1 = (long)(iVar12 * 4) * 4;
          iVar13 = bcmp(pGVar18,pGVar14 + (long)iVar5 * 4,sVar1);
          if (iVar13 != 0) {
            memcpy(pGVar18,pGVar14 + (long)iVar5 * 4,sVar1);
            bVar11 = true;
          }
          pGVar18 = pGVar18 + iVar12 * 4;
        }
        uVar23 = (int)uVar16 + 1;
        uVar16 = (ulong)uVar23;
      } while (uVar23 != uVar2);
      bVar11 = !bVar11;
    }
    pMVar19 = ctx;
    uVar23 = pMVar6->texbem_count;
    if ((ulong)uVar23 != 0) {
      if (pMVar6->fragment == (MOJOSHADER_glShader *)0x0) {
        __assert_fail("(!program->texbem_count) || (program->fragment)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                      ,0x9c4,"void MOJOSHADER_glProgramReady(void)");
      }
      if (3 < uVar23) {
        __assert_fail("program->texbem_count <= MAX_TEXBEMS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                      ,0x9d0,"void MOJOSHADER_glProgramReady(void)");
      }
      pMVar8 = pMVar6->fragment->parseData;
      uVar16 = (ulong)(uint)pMVar8->sampler_count;
      if (uVar16 == 0) {
        uVar15 = 0;
      }
      else {
        pGVar14 = pMVar6->ps_uniforms_float4 +
                  pMVar6->ps_uniforms_float4_count * 4 + (ulong)uVar23 * -8;
        pMVar9 = pMVar8->samplers;
        lVar20 = 0;
        uVar15 = 0;
        do {
          if (*(int *)((long)&pMVar9->texbem + lVar20) != 0) {
            uVar23 = *(uint *)((long)&pMVar9->index + lVar20);
            if ((int)uVar23 < 1) {
              __assert_fail("samps[i].index > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                            ,0x9d5,"void MOJOSHADER_glProgramReady(void)");
            }
            if (3 < uVar23) {
              __assert_fail("samps[i].index <= MAX_TEXBEMS",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                            ,0x9d6,"void MOJOSHADER_glProgramReady(void)");
            }
            uVar21 = (ulong)(uVar23 * 6 - 6);
            *(undefined8 *)(pGVar14 + 4) = *(undefined8 *)(pMVar19->texbem_state + uVar21 + 4);
            pGVar18 = pMVar19->texbem_state + uVar21;
            uVar10 = *(undefined8 *)(pGVar18 + 2);
            *(undefined8 *)pGVar14 = *(undefined8 *)pGVar18;
            *(undefined8 *)(pGVar14 + 2) = uVar10;
            pGVar14[6] = 0.0;
            pGVar14[7] = 0.0;
            pGVar14 = pGVar14 + 8;
            uVar15 = uVar15 + 1;
          }
          lVar20 = lVar20 + 0x18;
        } while (uVar16 * 0x18 != lVar20);
        uVar23 = pMVar6->texbem_count;
      }
      if (uVar15 != uVar23) {
        __assert_fail("texbem_count == program->texbem_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                      ,0x9e0,"void MOJOSHADER_glProgramReady(void)");
      }
    }
    pMVar19 = ctx;
    pMVar6->generation = ctx->generation;
    if (!bVar11) {
      (*pMVar19->profilePushUniforms)();
      return;
    }
  }
  return;
}

Assistant:

void MOJOSHADER_glProgramReady(void)
{
    MOJOSHADER_glProgram *program = ctx->bound_program;

    if (program == NULL)
        return;  // nothing to do.

    // Toggle vertex attribute arrays on/off, based on our needs.
    update_enabled_arrays();

    if (program->uses_pointsize != ctx->pointsize_enabled)
    {
        if (program->uses_pointsize)
            ctx->glEnable(GL_PROGRAM_POINT_SIZE);
        else
            ctx->glDisable(GL_PROGRAM_POINT_SIZE);
        ctx->pointsize_enabled = program->uses_pointsize;
    } // if

    // push Uniforms to the program from our register files...
    if ( ((program->uniform_count) || (program->texbem_count)) &&
         (program->generation != ctx->generation))
    {
        // vertex shader uniforms come first in program->uniforms array.
        const uint32 count = program->uniform_count;
        const GLfloat *srcf = ctx->vs_reg_file_f;
        const GLint *srci = ctx->vs_reg_file_i;
        const uint8 *srcb = ctx->vs_reg_file_b;
        MOJOSHADER_shaderType shader_type = MOJOSHADER_TYPE_VERTEX;
        GLfloat *dstf = program->vs_uniforms_float4;
        GLint *dsti = program->vs_uniforms_int4;
        GLint *dstb = program->vs_uniforms_bool;
        uint8 uniforms_changed = 0;
        uint32 i;

        for (i = 0; i < count; i++)
        {
            UniformMap *map = &program->uniforms[i];
            const MOJOSHADER_shaderType uniform_shader_type = map->shader_type;
            const MOJOSHADER_uniform *u = map->uniform;
            const MOJOSHADER_uniformType type = u->type;
            const int index = u->index;
            const int size = u->array_count ? u->array_count : 1;

            assert(!u->constant);

            // Did we switch from vertex to pixel (to geometry, etc)?
            if (shader_type != uniform_shader_type)
            {
                // we start with vertex, move to pixel, then to geometry, etc.
                //  The array should always be sorted as such.
                if (uniform_shader_type == MOJOSHADER_TYPE_PIXEL)
                {
                    assert(shader_type == MOJOSHADER_TYPE_VERTEX);
                    srcf = ctx->ps_reg_file_f;
                    srci = ctx->ps_reg_file_i;
                    srcb = ctx->ps_reg_file_b;
                    dstf = program->ps_uniforms_float4;
                    dsti = program->ps_uniforms_int4;
                    dstb = program->ps_uniforms_bool;
                } // if
                else
                {
                    // Should be ordered vertex, then pixel, then geometry.
                    assert(0 && "Unexpected shader type");
                } // else

                shader_type = uniform_shader_type;
            } // if

            if (type == MOJOSHADER_UNIFORM_FLOAT)
            {
                const size_t count = 4 * size;
                const GLfloat *f = &srcf[index * 4];
                if (memcmp(dstf, f, sizeof (GLfloat) * count) != 0)
                {
                    memcpy(dstf, f, sizeof (GLfloat) * count);
                    uniforms_changed = 1;
                }
                dstf += count;
            } // if
            else if (type == MOJOSHADER_UNIFORM_INT)
            {
                const size_t count = 4 * size;
                const GLint *i = &srci[index * 4];
                if (memcmp(dsti, i, sizeof (GLint) * count) != 0)
                {
                    memcpy(dsti, i, sizeof (GLint) * count);
                    uniforms_changed = 1;
                } // if
                dsti += count;
            } // else if
            else if (type == MOJOSHADER_UNIFORM_BOOL)
            {
                const size_t count = size;
                const uint8 *b = &srcb[index];
                size_t i;
                for (i = 0; i < count; i++)
                    if (dstb[i] != b[i])
                    {
                        dstb[i] = (GLint) b[i];
                        uniforms_changed = 1;
                    } // if
                dstb += count;
            } // else if

            // !!! FIXME: set constants that overlap the array.
        } // for

        assert((!program->texbem_count) || (program->fragment));
        if ((program->texbem_count) && (program->fragment))
        {
            const MOJOSHADER_parseData *pd = program->fragment->parseData;
            const int samp_count = pd->sampler_count;
            const MOJOSHADER_sampler *samps = pd->samplers;
            GLfloat *dstf = program->ps_uniforms_float4;
            int texbem_count = 0;

            dstf += (program->ps_uniforms_float4_count * 4) -
                     (program->texbem_count * 8);

            assert(program->texbem_count <= MAX_TEXBEMS);
            for (i = 0; i < samp_count; i++)
            {
                if (samps[i].texbem)
                {
                    assert(samps[i].index > 0);
                    assert(samps[i].index <= MAX_TEXBEMS);
                    memcpy(dstf, &ctx->texbem_state[6 * (samps[i].index-1)],
                           sizeof (GLfloat) * 6);
                    dstf[6] = 0.0f;
                    dstf[7] = 0.0f;
                    dstf += 8;
                    texbem_count++;
                } // if
            } // for

            assert(texbem_count == program->texbem_count);
        } // if

        program->generation = ctx->generation;

        if (uniforms_changed)
            ctx->profilePushUniforms();
    } // if
}